

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O0

void IT8951SetImgBufBaseAddr(uint32_t ulImgBufAddr)

{
  uint16_t usWordL;
  uint16_t usWordH;
  uint32_t ulImgBufAddr_local;
  
  IT8951WriteReg(0x20a,(uint16_t)(ulImgBufAddr >> 0x10));
  IT8951WriteReg(0x208,(uint16_t)ulImgBufAddr);
  return;
}

Assistant:

void IT8951SetImgBufBaseAddr(uint32_t ulImgBufAddr)
{
	uint16_t usWordH = (uint16_t)((ulImgBufAddr >> 16) & 0x0000FFFF);
	uint16_t usWordL = (uint16_t)( ulImgBufAddr & 0x0000FFFF);
	//Write LISAR Reg
	IT8951WriteReg(LISAR + 2 ,usWordH);
	IT8951WriteReg(LISAR ,usWordL);
}